

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

istreambuf_iterator<char,_std::char_traits<char>_>
picojson::
_parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
          (default_parse_context *ctx,istreambuf_iterator<char,_std::char_traits<char>_> *first,
          istreambuf_iterator<char,_std::char_traits<char>_> *last,string *err)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar3;
  undefined1 local_98 [8];
  char buf [64];
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> in;
  
  buf._56_8_ = first->_M_sbuf;
  in.cur_._M_sbuf._0_4_ = (undefined4)*(undefined8 *)&first->_M_c;
  bVar1 = _parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
                    (ctx,(input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                         (buf + 0x38));
  if ((err != (string *)0x0) && (!bVar1)) {
    __stream = (FILE *)local_98;
    snprintf((char *)__stream,0x40,"syntax error at line %d near: ",1);
    std::__cxx11::string::assign((char *)err);
    while( true ) {
      iVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc
                        ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                         (buf + 0x38),__stream);
      if ((iVar2 == -1) || (iVar2 == 10)) break;
      if (0x1f < iVar2) {
        __stream = (FILE *)(ulong)(uint)(int)(char)iVar2;
        std::__cxx11::string::push_back((char)err);
      }
    }
  }
  iVar3._M_c = in.cur_._M_sbuf._0_4_;
  iVar3._M_sbuf = (streambuf_type *)buf._56_8_;
  iVar3._12_4_ = 0;
  return iVar3;
}

Assistant:

inline Iter _parse(Context& ctx, const Iter& first, const Iter& last, std::string* err) {
    input<Iter> in(first, last);
    if (! _parse(ctx, in) && err != NULL) {
      char buf[64];
      SNPRINTF(buf, sizeof(buf), "syntax error at line %d near: ", in.line());
      *err = buf;
      while (1) {
    int ch = in.getc();
    if (ch == -1 || ch == '\n') {
      break;
    } else if (ch >= ' ') {
      err->push_back(ch);
    }
      }
    }
    return in.cur();
  }